

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

Optimizer * __thiscall spvtools::Optimizer::RegisterPass(Optimizer *this,PassToken *p)

{
  Impl IVar1;
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var2;
  _Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false> _Var3;
  pointer *__ptr;
  __uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> local_48;
  _Any_data local_40;
  code *local_30;
  
  IVar1.pass._M_t.
  super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
  super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl =
       ((p->impl_)._M_t.
        super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl)->pass;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            *)&local_40,
           &(((this->impl_)._M_t.
              super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
              .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->pass_manager
            ).consumer_);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  operator=((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             *)((long)IVar1.pass._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                      .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl + 8),
            (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  _Var2._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
  _Var3._M_head_impl =
       (p->impl_)._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  local_48._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
  super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl =
       *(tuple<spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_> *)
        &(_Var3._M_head_impl)->pass;
  (_Var3._M_head_impl)->pass =
       (unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>)0x0;
  std::
  vector<std::unique_ptr<spvtools::opt::Pass,std::default_delete<spvtools::opt::Pass>>,std::allocator<std::unique_ptr<spvtools::opt::Pass,std::default_delete<spvtools::opt::Pass>>>>
  ::emplace_back<std::unique_ptr<spvtools::opt::Pass,std::default_delete<spvtools::opt::Pass>>>
            ((vector<std::unique_ptr<spvtools::opt::Pass,std::default_delete<spvtools::opt::Pass>>,std::allocator<std::unique_ptr<spvtools::opt::Pass,std::default_delete<spvtools::opt::Pass>>>>
              *)((long)&(_Var2._M_head_impl)->pass_manager + 0x20),
             (unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> *)&local_48
            );
  if ((_Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>)
      local_48._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
      super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
    (**(code **)(*(long *)local_48._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                          .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl + 8))();
  }
  return this;
}

Assistant:

Optimizer& Optimizer::RegisterPass(PassToken&& p) {
  // Change to use the pass manager's consumer.
  p.impl_->pass->SetMessageConsumer(consumer());
  impl_->pass_manager.AddPass(std::move(p.impl_->pass));
  return *this;
}